

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLayeredFramebuffer.cpp
# Opt level: O0

IterateResult __thiscall
glcts::GeometryShaderLayeredFramebufferStencil::iterate
          (GeometryShaderLayeredFramebufferStencil *this)

{
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  deUint32 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  TestError *pTVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  undefined8 in_stack_ffffffffffffe9b8;
  undefined4 uVar11;
  ulong uVar9;
  undefined8 uVar10;
  char **sh2_body_parts;
  undefined8 uVar12;
  undefined4 uVar13;
  MessageBuilder local_14f8;
  uchar *local_1378;
  uchar *result_row;
  uchar *ref_row;
  int row_size;
  int pixel_size;
  int local_11e0;
  int local_11dc;
  int y;
  int x;
  uchar result_data [128];
  uchar ref_data [128];
  int local_10cc;
  uint local_10c8;
  int m;
  GLenum fbo_completeness;
  undefined1 local_10b8 [8];
  uchar slice_4_data [1024];
  uchar slice_3_data [1024];
  uchar slice_2_data [1024];
  uchar slice_1_data [1024];
  uchar slice_null_data [128];
  char *pcStack_30;
  int n;
  char *gs_code;
  char *fs_code;
  Functions *gl;
  GeometryShaderLayeredFramebufferStencil *this_local;
  
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffe9b8 >> 0x20);
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  fs_code = (char *)CONCAT44(extraout_var,iVar2);
  gs_code = 
  "${VERSION}\n\nprecision highp float;\n\nout vec4 result;\n\nvoid main()\n{\n    result = vec4(1, 1, 1, 1);\n}\n"
  ;
  pcStack_30 = 
  "${VERSION}\n${GEOMETRY_SHADER_REQUIRE}\n\nprecision highp float;\n\nlayout (points)                            in;\nlayout (triangle_strip, max_vertices = 16) out;\n\nvoid main()\n{\n    for (int n = 0; n < 4; ++n)\n    {\n        gl_Position = vec4(1, -1, 0, 1);\n        gl_Layer    = n;\n        EmitVertex();\n\n        gl_Position = vec4(1,  1, 0, 1);\n        gl_Layer    = n;\n        EmitVertex();\n\n        gl_Position = vec4(-1, -1, 0, 1);\n        gl_Layer    = n;\n        EmitVertex();\n\n        gl_Position = vec4(-1,  1, 0, 1);\n        gl_Layer    = n;\n        EmitVertex();\n\n        EndPrimitive();\n    }\n\n}\n"
  ;
  memset(slice_1_data + 0x3f8,0,0x80);
  memset(slice_2_data + 0x3f8,0,0x400);
  memset(slice_3_data + 0x3f8,0,0x400);
  memset(slice_4_data + 0x3f8,0,0x400);
  memset(local_10b8,0,0x400);
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
               ,0x4e1);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  GVar3 = (**(code **)(fs_code + 0x3f0))(0x8b30);
  this->m_fs_id = GVar3;
  GVar3 = (**(code **)(fs_code + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER);
  this->m_gs_id = GVar3;
  GVar3 = (**(code **)(fs_code + 0x3c8))();
  this->m_po_id = GVar3;
  GVar3 = (**(code **)(fs_code + 0x3f0))(0x8b31);
  this->m_vs_id = GVar3;
  dVar4 = (**(code **)(fs_code + 0x800))();
  glu::checkError(dVar4,"Could not create shader or program objects",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                  ,0x4ea);
  sh2_body_parts = &stack0xffffffffffffffd0;
  uVar9 = CONCAT44(uVar11,1);
  bVar1 = TestCaseBase::buildProgram
                    (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&gs_code,this->m_gs_id,
                     1,sh2_body_parts,this->m_vs_id,1,&TestCaseBase::m_boilerplate_vs_code,
                     (bool *)0x0);
  uVar11 = (undefined4)((ulong)sh2_body_parts >> 0x20);
  if (!bVar1) {
    pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar6,"Could not build test program object",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
               ,0x4f0);
    __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(fs_code + 0x708))(1,&this->m_vao_id);
  (**(code **)(fs_code + 0xd8))(this->m_vao_id);
  dVar4 = (**(code **)(fs_code + 0x800))();
  glu::checkError(dVar4,"Could not create & bind a vertex array object.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                  ,0x4f7);
  slice_null_data[0x7c] = '\0';
  slice_null_data[0x7d] = '\0';
  slice_null_data[0x7e] = '\0';
  slice_null_data[0x7f] = '\0';
  for (; (int)slice_null_data._124_4_ < 0x400; slice_null_data._124_4_ = slice_null_data._124_4_ + 1
      ) {
    slice_2_data[(long)(int)slice_null_data._124_4_ + 0x3f8] = '\x02';
    slice_3_data[(long)(int)slice_null_data._124_4_ + 0x3f8] = '\x01';
    slice_4_data[(long)(int)slice_null_data._124_4_ + 0x3f8] = '\0';
    local_10b8[(int)slice_null_data._124_4_] = 0;
  }
  (**(code **)(fs_code + 0x6f8))(1,&this->m_to_a_id);
  (**(code **)(fs_code + 0x6f8))(1,&this->m_to_b_id);
  (**(code **)(fs_code + 0xb8))(0x8c1a,this->m_to_a_id);
  uVar9 = uVar9 & 0xffffffff00000000;
  uVar12 = CONCAT44(uVar11,0x1908);
  uVar11 = 0;
  (**(code **)(fs_code + 0x1320))(0x8c1a,0,0x8058,8,4,4,uVar9,uVar12,0x1401,0);
  uVar10 = CONCAT44((int)(uVar9 >> 0x20),4);
  uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),1);
  (**(code **)(fs_code + 0x13c0))
            (0x8c1a,0,0,0,0,8,uVar10,uVar12,0x1908,CONCAT44(uVar11,0x1401),slice_1_data + 0x3f8);
  uVar10 = CONCAT44((int)((ulong)uVar10 >> 0x20),4);
  uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),1);
  (**(code **)(fs_code + 0x13c0))(0x8c1a,0,0,0,1,8,uVar10,uVar12,0x1908,0x1401,slice_1_data + 0x3f8)
  ;
  uVar10 = CONCAT44((int)((ulong)uVar10 >> 0x20),4);
  uVar12 = CONCAT44((int)((ulong)uVar12 >> 0x20),1);
  (**(code **)(fs_code + 0x13c0))(0x8c1a,0,0,0,2,8,uVar10,uVar12,0x1908,0x1401,slice_1_data + 0x3f8)
  ;
  uVar9 = CONCAT44((int)((ulong)uVar10 >> 0x20),4);
  uVar10 = CONCAT44((int)((ulong)uVar12 >> 0x20),1);
  (**(code **)(fs_code + 0x13c0))(0x8c1a,0,0,0,3,8,uVar9,uVar10,0x1908,0x1401,slice_1_data + 0x3f8);
  uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
  dVar4 = (**(code **)(fs_code + 0x800))();
  glu::checkError(dVar4,"Could not set up texture object A.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                  ,0x519);
  (**(code **)(fs_code + 0xb8))(0x8c1a,this->m_to_b_id);
  uVar13 = 0;
  (**(code **)(fs_code + 0x1320))
            (0x8c1a,0,0x8cad,8,4,4,uVar9 & 0xffffffff00000000,CONCAT44(uVar11,0x84f9),0x8dad,0);
  (**(code **)(fs_code + 0x13c0))
            (0x8c1a,0,0,0,0,8,4,1,0x84f9,CONCAT44(uVar13,0x8dad),slice_2_data + 0x3f8);
  (**(code **)(fs_code + 0x13c0))(0x8c1a,0,0,0,1,8,4,1,0x84f9,0x8dad,slice_3_data + 0x3f8);
  (**(code **)(fs_code + 0x13c0))(0x8c1a,0,0,0,2,8,4,1,0x84f9,0x8dad,slice_4_data + 0x3f8);
  (**(code **)(fs_code + 0x13c0))(0x8c1a,0,0,0,3,8,4,1,0x84f9,0x8dad,local_10b8);
  dVar4 = (**(code **)(fs_code + 0x800))();
  glu::checkError(dVar4,"Could not set up texture object B.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                  ,0x52c);
  (**(code **)(fs_code + 0x4e8))(0xb71);
  (**(code **)(fs_code + 0x5e0))(0xb90);
  (**(code **)(fs_code + 0x12c8))(0x201,0,0xffffffff);
  (**(code **)(fs_code + 0x6d0))(1,&this->m_fbo_id);
  (**(code **)(fs_code + 0x78))(0x8ca9,this->m_fbo_id);
  (**(code **)(fs_code + 0x690))(0x8ca9,0x8ce0,this->m_to_a_id,0);
  (**(code **)(fs_code + 0x690))(0x8ca9,0x821a,this->m_to_b_id,0);
  dVar4 = (**(code **)(fs_code + 0x800))();
  glu::checkError(dVar4,"Could not set up draw framebuffer.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                  ,0x53c);
  (**(code **)(fs_code + 0x1680))(this->m_po_id);
  (**(code **)(fs_code + 0x538))(0,0,1);
  dVar4 = (**(code **)(fs_code + 0x800))();
  glu::checkError(dVar4,"Draw call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                  ,0x542);
  slice_null_data[0x7c] = '\0';
  slice_null_data[0x7d] = '\0';
  slice_null_data[0x7e] = '\0';
  slice_null_data[0x7f] = '\0';
  while( true ) {
    if (3 < (int)slice_null_data._124_4_) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    local_10c8 = 0;
    memset(result_data + 0x78,0,0x80);
    memset(&y,0,0x80);
    local_11dc = 0;
    local_11e0 = 0;
    (**(code **)(fs_code + 0x78))(0x8ca8,this->m_fbo_id);
    (**(code **)(fs_code + 0x6b8))(0x8ca8,0x8ce0,this->m_to_a_id,0,slice_null_data._124_4_);
    (**(code **)(fs_code + 0x690))(0x8ca8,0x821a,0);
    dVar4 = (**(code **)(fs_code + 0x800))();
    glu::checkError(dVar4,"Could not set up read framebuffer.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0x554);
    local_10c8 = (**(code **)(fs_code + 0x170))(0x8ca8);
    if (local_10c8 != 0x8cd5) break;
    for (local_10cc = 0; local_10cc < 0x80; local_10cc = local_10cc + 1) {
      if ((int)slice_null_data._124_4_ < 2) {
        result_data[(long)local_10cc + 0x78] = 0xff;
      }
      else {
        result_data[(long)local_10cc + 0x78] = '\0';
      }
    }
    (**(code **)(fs_code + 0x1220))(0,0,8,4,0x1908,0x1401,&y);
    dVar4 = (**(code **)(fs_code + 0x800))();
    glu::checkError(dVar4,"glReadPixels() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                    ,0x571);
    for (local_11e0 = 0; local_11e0 < 4; local_11e0 = local_11e0 + 1) {
      ref_row._4_4_ = 4;
      ref_row._0_4_ = 0x20;
      result_row = result_data + (long)(local_11e0 * 0x20) + 0x78;
      local_1378 = (uchar *)((long)&y + (long)(local_11e0 * 0x20));
      for (local_11dc = 0; local_11dc < 8; local_11dc = local_11dc + 1) {
        iVar2 = memcmp(result_row,local_1378,(long)ref_row._4_4_);
        if (iVar2 != 0) {
          pTVar7 = tcu::TestContext::getLog
                             ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_14f8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar8 = tcu::MessageBuilder::operator<<(&local_14f8,(char (*) [4])0x2b7e4e5);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_11dc);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [4])" y=");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_11e0);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [18])"): Rendered data ");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2afcbef);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_1378);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_1378 + 1);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_1378 + 2);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,local_1378 + 3);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a85ff4);
          pMVar8 = tcu::MessageBuilder::operator<<
                             (pMVar8,(char (*) [35])" is different from reference data ");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2afcbef);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,result_row);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,result_row + 1);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,result_row + 2);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a3caab);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,result_row + 3);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a85ff4);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_14f8);
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"Data comparison failed",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
                     ,0x585);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        result_row = result_row + ref_row._4_4_;
        local_1378 = local_1378 + ref_row._4_4_;
      }
    }
    slice_null_data._124_4_ = slice_null_data._124_4_ + 1;
  }
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&row_size,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&row_size,(char (*) [25])"Read FBO is incomplete: ");
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2c316fc);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_10c8);
  pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x29dc08e);
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&row_size);
  pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar6,"Read FBO is incomplete.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLayeredFramebuffer.cpp"
             ,0x55e);
  __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

tcu::TestNode::IterateResult GeometryShaderLayeredFramebufferStencil::iterate(void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

/* Test-wide definitions */
#define N_TEXTURE_COMPONENTS (4)
#define TEXTURE_DEPTH (4)
#define TEXTURE_HEIGHT (4)
#define TEXTURE_WIDTH (8)

	/* Fragment shader code */
	const char* fs_code = "${VERSION}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "out vec4 result;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    result = vec4(1, 1, 1, 1);\n"
						  "}\n";

	/* Geometry shader code */
	const char* gs_code = "${VERSION}\n"
						  "${GEOMETRY_SHADER_REQUIRE}\n"
						  "\n"
						  "precision highp float;\n"
						  "\n"
						  "layout (points)                            in;\n"
						  "layout (triangle_strip, max_vertices = 16) out;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    for (int n = 0; n < 4; ++n)\n"
						  "    {\n"
						  "        gl_Position = vec4(1, -1, 0, 1);\n"
						  "        gl_Layer    = n;\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Position = vec4(1,  1, 0, 1);\n"
						  "        gl_Layer    = n;\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Position = vec4(-1, -1, 0, 1);\n"
						  "        gl_Layer    = n;\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        gl_Position = vec4(-1,  1, 0, 1);\n"
						  "        gl_Layer    = n;\n"
						  "        EmitVertex();\n"
						  "\n"
						  "        EndPrimitive();\n"
						  "    }\n"
						  "\n"
						  "}\n";

	/* General variables */
	int n = 0;

	unsigned char slice_null_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 1 /* byte  per texel */] = { 0 };
	unsigned char slice_1_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */]	= { 0 };
	unsigned char slice_2_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */]	= { 0 };
	unsigned char slice_3_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */]	= { 0 };
	unsigned char slice_4_data[TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */]	= { 0 };

	/* This test should only run if EXT_geometry_shader is supported */
	if (!m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Create shader & program objects */
	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_po_id = gl.createProgram();
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader or program objects");

	/* Build test program object */
	if (!buildProgram(m_po_id, m_fs_id, 1 /* parts */, &fs_code, m_gs_id, 1 /* parts */, &gs_code, m_vs_id,
					  1 /* parts */, &m_boilerplate_vs_code))
	{
		TCU_FAIL("Could not build test program object");
	}

	/* Generate and bind a vertex array object */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create & bind a vertex array object.");

	/* Configure slice data */
	for (n = 0; n < TEXTURE_DEPTH * TEXTURE_WIDTH * TEXTURE_HEIGHT * 8 /* bytes per texel */; ++n)
	{
		/* We are okay with depth data being filled with glitch, but need the stencil data to be
		 * as per test spec. To keep code simple, we do not differentiate between floating-point and
		 * stencil part.
		 */
		slice_1_data[n] = 2;
		slice_2_data[n] = 1;

		/* Slices 3 and 4 should be filled with 0s */
		slice_3_data[n] = 0;
		slice_4_data[n] = 0;
	} /* for (all pixels making up slices) */

	/* Set up texture objects */
	gl.genTextures(1, &m_to_a_id);
	gl.genTextures(1, &m_to_b_id);

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_a_id);
	gl.texImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, GL_RGBA8, TEXTURE_WIDTH, TEXTURE_HEIGHT, TEXTURE_DEPTH,
				  0 /* border */, GL_RGBA, GL_UNSIGNED_BYTE, NULL);

	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, slice_null_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, slice_null_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, slice_null_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, slice_null_data);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture object A.");

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_b_id);
	gl.texImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, GL_DEPTH32F_STENCIL8, TEXTURE_WIDTH, TEXTURE_HEIGHT,
				  TEXTURE_DEPTH, 0 /* border */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV, NULL);

	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 0 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV,
					 slice_1_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 1 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV,
					 slice_2_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 2 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV,
					 slice_3_data);
	gl.texSubImage3D(GL_TEXTURE_2D_ARRAY, 0 /* level */, 0 /* xoffset */, 0 /* yoffset */, 3 /* zoffset */,
					 TEXTURE_WIDTH, TEXTURE_HEIGHT, 1 /* depth */, GL_DEPTH_STENCIL, GL_FLOAT_32_UNSIGNED_INT_24_8_REV,
					 slice_4_data);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up texture object B.");

	/* Set up depth tests */
	gl.disable(GL_DEPTH_TEST);

	/* Set up stencil tests */
	gl.enable(GL_STENCIL_TEST);
	gl.stencilFunc(GL_LESS, 0, /* reference value */ 0xFFFFFFFF /* mask */);

	/* Set up framebuffer objects */
	gl.genFramebuffers(1, &m_fbo_id);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_id);

	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_a_id, 0 /* level */);
	gl.framebufferTexture(GL_DRAW_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, m_to_b_id, 0 /* level */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up draw framebuffer.");

	/* Issue the draw call. */
	gl.useProgram(m_po_id);
	gl.drawArrays(GL_POINTS, 0 /* first */, 1 /* count */);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw call failed.");

	/* Check the results */
	for (n = 0; n < 4 /* layers */; ++n)
	{
		glw::GLenum   fbo_completeness													 = GL_NONE;
		int			  m																	 = 0;
		unsigned char ref_data[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS]	= { 0 };
		unsigned char result_data[TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS] = { 0 };
		int			  x																	 = 0;
		int			  y																	 = 0;

		/* Configure the read framebuffer */
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_id);

		gl.framebufferTextureLayer(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_to_a_id, 0 /* level */, n);
		gl.framebufferTexture(GL_READ_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, 0 /* texture */, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set up read framebuffer.");

		/* Verify read framebuffer is considered complete */
		fbo_completeness = gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER);

		if (fbo_completeness != GL_FRAMEBUFFER_COMPLETE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Read FBO is incomplete: "
							   << "[" << fbo_completeness << "]" << tcu::TestLog::EndMessage;

			TCU_FAIL("Read FBO is incomplete.");
		}

		/* Build reference data */
		for (m = 0; m < TEXTURE_WIDTH * TEXTURE_HEIGHT * N_TEXTURE_COMPONENTS; ++m)
		{
			if (n < 2)
			{
				ref_data[m] = 255;
			}
			else
			{
				ref_data[m] = 0;
			}
		} /* for (all reference pixels) */

		/* Read the rendered data */
		gl.readPixels(0 /* x */, 0 /* y */, TEXTURE_WIDTH, TEXTURE_HEIGHT, GL_RGBA, GL_UNSIGNED_BYTE, result_data);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() failed");

		for (y = 0; y < TEXTURE_HEIGHT; ++y)
		{
			int			   pixel_size = N_TEXTURE_COMPONENTS;
			int			   row_size   = pixel_size * TEXTURE_WIDTH;
			unsigned char* ref_row	= ref_data + y * row_size;
			unsigned char* result_row = result_data + y * row_size;

			for (x = 0; x < TEXTURE_WIDTH; ++x)
			{
				if (memcmp(ref_row, result_row, pixel_size) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "(x=" << x << " y=" << y << "): Rendered data "
									   << "(" << result_row[0] << ", " << result_row[1] << ", " << result_row[2] << ", "
									   << result_row[3] << ")"
									   << " is different from reference data "
									   << "(" << ref_row[0] << ", " << ref_row[1] << ", " << ref_row[2] << ", "
									   << ref_row[3] << ")" << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (memcmp(ref_row, result_row, pixel_size) != 0) */

				ref_row += pixel_size;
				result_row += pixel_size;
			} /* for (all pixels in a row) */
		}	 /* for (all pixels) */
	}		  /* for (all layers) */

	/* Done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;

#undef N_TEXTURE_COMPONENTS
#undef TEXTURE_DEPTH
#undef TEXTURE_HEIGHT
#undef TEXTURE_WIDTH
}